

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O3

void __thiscall
icu_63::SpoofImpl::setAllowedLocales(SpoofImpl *this,char *localesList,UErrorCode *status)

{
  UnicodeSet *this_00;
  int iVar1;
  int iVar2;
  size_t sVar3;
  SpoofImpl *pSVar4;
  char *pcVar5;
  UnicodeSet *pUVar6;
  UnicodeSet *pUVar7;
  UErrorCode *pUVar8;
  void *__child_stack;
  SpoofImpl *pSVar9;
  uint n;
  void *p;
  SpoofImpl *this_01;
  void *in_R8;
  int iVar10;
  UnicodeSet tempSet;
  UnicodeSet allowedChars;
  UnicodeSet local_e0;
  UnicodeSet local_88;
  undefined4 extraout_var;
  size_t size;
  
  UnicodeSet::UnicodeSet(&local_88);
  sVar3 = strlen(localesList);
  iVar10 = 0;
  pSVar9 = (SpoofImpl *)localesList;
  do {
    pSVar4 = (SpoofImpl *)strchr((char *)pSVar9,0x2c);
    iVar1 = 1 - (int)pSVar9;
    do {
      iVar2 = iVar1;
      this_01 = pSVar9;
      pSVar9 = (SpoofImpl *)((long)&(this_01->super_UObject)._vptr_UObject + 1);
      iVar1 = iVar2 + -1;
    } while (*(char *)&(this_01->super_UObject)._vptr_UObject == ' ');
    if (pSVar4 == (SpoofImpl *)0x0) {
      pSVar4 = (SpoofImpl *)(localesList + sVar3);
    }
    n = iVar2 + (int)pSVar4;
    pSVar9 = pSVar4;
    do {
      size = (size_t)n;
      pSVar9 = (SpoofImpl *)&pSVar9[-1].field_0x2f;
      if (pSVar9 <= this_01) {
        if (iVar10 != 0) goto LAB_001599a1;
        uprv_free_63(this->fAllowedLocales);
        pcVar5 = uprv_strdup_63("");
        this->fAllowedLocales = pcVar5;
        pUVar7 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,size);
        if (pUVar7 != (UnicodeSet *)0x0) {
          p = (void *)0x0;
          UnicodeSet::UnicodeSet(pUVar7,0,0x10ffff);
          if (this->fAllowedLocales != (char *)0x0) {
            UnicodeSet::freeze(pUVar7);
            pUVar6 = this->fAllowedCharsSet;
            if (pUVar6 != (UnicodeSet *)0x0) {
              UnicodeSet::~UnicodeSet(pUVar6);
            }
            UMemory::operator_delete((UMemory *)pUVar6,p);
            this->fAllowedCharsSet = pUVar7;
            *(byte *)&this->fChecks = (byte)this->fChecks & 0xbf;
            goto LAB_00159b0f;
          }
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
        goto LAB_00159b0f;
      }
      n = n - 1;
    } while (*(char *)pSVar9 == ' ');
    pcVar5 = uprv_strndup_63((char *)this_01,n);
    addScriptChars(this_01,pcVar5,&local_88,status);
    uprv_free_63(pcVar5);
    pSVar9 = (SpoofImpl *)((long)&(pSVar4->super_UObject)._vptr_UObject + 1);
  } while ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
          (iVar10 = iVar10 + 1, pSVar9 < (SpoofImpl *)(localesList + sVar3)));
LAB_001599a1:
  UnicodeSet::UnicodeSet(&local_e0);
  UnicodeSet::applyIntPropertyValue(&local_e0,UCHAR_SCRIPT,0,status);
  UnicodeSet::addAll(&local_88,&local_e0);
  pUVar8 = status;
  UnicodeSet::applyIntPropertyValue(&local_e0,UCHAR_SCRIPT,1,status);
  iVar10 = (int)pUVar8;
  pUVar7 = &local_e0;
  UnicodeSet::addAll(&local_88,pUVar7);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar10 = UnicodeSet::clone(&local_88,(__fn *)pUVar7,__child_stack,iVar10,in_R8);
    pUVar6 = (UnicodeSet *)CONCAT44(extraout_var,iVar10);
    pcVar5 = uprv_strdup_63(localesList);
    if (pcVar5 == (char *)0x0 || pUVar6 == (UnicodeSet *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      uprv_free_63(this->fAllowedLocales);
      this->fAllowedLocales = pcVar5;
      UnicodeSet::freeze(pUVar6);
      this_00 = this->fAllowedCharsSet;
      if (this_00 != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet(this_00);
      }
      UMemory::operator_delete((UMemory *)this_00,pUVar7);
      this->fAllowedCharsSet = pUVar6;
      *(byte *)&this->fChecks = (byte)this->fChecks | 0x40;
    }
  }
  UnicodeSet::~UnicodeSet(&local_e0);
LAB_00159b0f:
  UnicodeSet::~UnicodeSet(&local_88);
  return;
}

Assistant:

void SpoofImpl::setAllowedLocales(const char *localesList, UErrorCode &status) {
    UnicodeSet    allowedChars;
    UnicodeSet    *tmpSet = NULL;
    const char    *locStart = localesList;
    const char    *locEnd = NULL;
    const char    *localesListEnd = localesList + uprv_strlen(localesList);
    int32_t        localeListCount = 0;   // Number of locales provided by caller.

    // Loop runs once per locale from the localesList, a comma separated list of locales.
    do {
        locEnd = uprv_strchr(locStart, ',');
        if (locEnd == NULL) {
            locEnd = localesListEnd;
        }
        while (*locStart == ' ') {
            locStart++;
        }
        const char *trimmedEnd = locEnd-1;
        while (trimmedEnd > locStart && *trimmedEnd == ' ') {
            trimmedEnd--;
        }
        if (trimmedEnd <= locStart) {
            break;
        }
        const char *locale = uprv_strndup(locStart, (int32_t)(trimmedEnd + 1 - locStart));
        localeListCount++;

        // We have one locale from the locales list.
        // Add the script chars for this locale to the accumulating set of allowed chars.
        // If the locale is no good, we will be notified back via status.
        addScriptChars(locale, &allowedChars, status);
        uprv_free((void *)locale);
        if (U_FAILURE(status)) {
            break;
        }
        locStart = locEnd + 1;
    } while (locStart < localesListEnd);

    // If our caller provided an empty list of locales, we disable the allowed characters checking
    if (localeListCount == 0) {
        uprv_free((void *)fAllowedLocales);
        fAllowedLocales = uprv_strdup("");
        tmpSet = new UnicodeSet(0, 0x10ffff);
        if (fAllowedLocales == NULL || tmpSet == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        } 
        tmpSet->freeze();
        delete fAllowedCharsSet;
        fAllowedCharsSet = tmpSet;
        fChecks &= ~USPOOF_CHAR_LIMIT;
        return;
    }

        
    // Add all common and inherited characters to the set of allowed chars.
    UnicodeSet tempSet;
    tempSet.applyIntPropertyValue(UCHAR_SCRIPT, USCRIPT_COMMON, status);
    allowedChars.addAll(tempSet);
    tempSet.applyIntPropertyValue(UCHAR_SCRIPT, USCRIPT_INHERITED, status);
    allowedChars.addAll(tempSet);
    
    // If anything went wrong, we bail out without changing
    // the state of the spoof checker.
    if (U_FAILURE(status)) {
        return;
    }

    // Store the updated spoof checker state.
    tmpSet = static_cast<UnicodeSet *>(allowedChars.clone());
    const char *tmpLocalesList = uprv_strdup(localesList);
    if (tmpSet == NULL || tmpLocalesList == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    uprv_free((void *)fAllowedLocales);
    fAllowedLocales = tmpLocalesList;
    tmpSet->freeze();
    delete fAllowedCharsSet;
    fAllowedCharsSet = tmpSet;
    fChecks |= USPOOF_CHAR_LIMIT;
}